

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageSetAAPixelColor(gdImagePtr im,int x,int y,int color,int t)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int b;
  int g;
  int r;
  int p;
  int db;
  int dg;
  int dr;
  int t_local;
  int color_local;
  int y_local;
  int x_local;
  gdImagePtr im_local;
  
  if ((((im->cy1 <= y) && (y <= im->cy2)) && (im->cx1 <= x)) &&
     (((x <= im->cx2 && (uVar1 = gdImageGetPixel(im,x,y), uVar1 != color)) &&
      ((uVar1 != im->AA_dont_blend || (t == 0)))))) {
    iVar2 = (int)(color & 0xff0000U) >> 0x10;
    iVar3 = (int)(color & 0xff00U) >> 8;
    uVar4 = color & 0xff;
    iVar5 = (int)(uVar1 & 0xff0000) >> 0x10;
    iVar6 = (int)(uVar1 & 0xff00) >> 8;
    im->tpixels[y][x] =
         (iVar2 + ((iVar5 - iVar2) * t + ((iVar5 - iVar2) * t >> 8) + 0x80 >> 8)) * 0x10000 +
         (iVar3 + ((iVar6 - iVar3) * t + ((iVar6 - iVar3) * t >> 8) + 0x80 >> 8)) * 0x100 +
         uVar4 + ((int)(((uVar1 & 0xff) - uVar4) * t + ((int)(((uVar1 & 0xff) - uVar4) * t) >> 8) +
                       0x80) >> 8);
  }
  return;
}

Assistant:

static void gdImageSetAAPixelColor(gdImagePtr im, int x, int y, int color, int t)
{
	int dr,dg,db,p,r,g,b;

	/* 2.0.34: watch out for out of range calls */
	if (!gdImageBoundsSafeMacro(im, x, y)) {
		return;
	}
	p = gdImageGetPixel(im,x,y);
	/* TBB: we have to implement the dont_blend stuff to provide
	  the full feature set of the old implementation */
	if ((p == color)
	        || ((p == im->AA_dont_blend)
	            && (t != 0x00))) {
		return;
	}
	dr = gdTrueColorGetRed(color);
	dg = gdTrueColorGetGreen(color);
	db = gdTrueColorGetBlue(color);

	r = gdTrueColorGetRed(p);
	g = gdTrueColorGetGreen(p);
	b = gdTrueColorGetBlue(p);

	BLEND_COLOR(t, dr, r, dr);
	BLEND_COLOR(t, dg, g, dg);
	BLEND_COLOR(t, db, b, db);
	im->tpixels[y][x] = gdTrueColorAlpha(dr, dg, db, gdAlphaOpaque);
}